

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void __thiscall vw::learn(vw *this,multi_ex *ec)

{
  undefined8 uVar1;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  stringstream __msg;
  size_t in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  string *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  vw_exception *in_stack_fffffffffffffe50;
  stringstream local_198 [16];
  ostream local_188;
  learner<char,_char> *in_stack_ffffffffffffffe0;
  
  if (((ulong)in_RDI[1].super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[0x1d] & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(&local_188,"This reduction does not support multi-line example.");
    uVar1 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
               in_stack_fffffffffffffe38);
    __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (((ulong)in_RDI[0x22d].super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Vector_impl_data._M_start & 0x10000) == 0) {
    LEARNER::as_multiline<char,char>(in_stack_ffffffffffffffe0);
    LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
              ((learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
               CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),in_RDI,
               in_stack_fffffffffffffe20);
  }
  else {
    LEARNER::as_multiline<char,char>(in_stack_ffffffffffffffe0);
    LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
              ((learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
               CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),in_RDI,
               in_stack_fffffffffffffe20);
  }
  return;
}

Assistant:

void vw::learn(multi_ex& ec)
{
  if (!l->is_multiline)
    THROW("This reduction does not support multi-line example.");

  if (!training)
    LEARNER::as_multiline(l)->predict(ec);
  else
    LEARNER::as_multiline(l)->learn(ec);
}